

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2s_Simd128.c
# Opt level: O0

void Hacl_Hash_Blake2s_Simd128_update_last
               (uint32_t len,Lib_IntVector_Intrinsics_vec128 *wv,
               Lib_IntVector_Intrinsics_vec128 *hash,uint64_t prev,uint32_t rem,uint8_t *d)

{
  uint64_t totlen;
  uint8_t *last;
  uint8_t b [64];
  uint8_t *d_local;
  uint32_t rem_local;
  uint64_t prev_local;
  Lib_IntVector_Intrinsics_vec128 *hash_local;
  Lib_IntVector_Intrinsics_vec128 *wv_local;
  uint32_t len_local;
  
  b._56_8_ = d;
  memset(&last,0,0x40);
  memcpy(&last,(void *)((b._56_8_ + (ulong)len) - (ulong)rem),(ulong)rem);
  update_block(wv,hash,true,prev + len,(uint8_t *)&last);
  Lib_Memzero0_memzero0(&last,0x40);
  return;
}

Assistant:

void
Hacl_Hash_Blake2s_Simd128_update_last(
  uint32_t len,
  Lib_IntVector_Intrinsics_vec128 *wv,
  Lib_IntVector_Intrinsics_vec128 *hash,
  uint64_t prev,
  uint32_t rem,
  uint8_t *d
)
{
  uint8_t b[64U] = { 0U };
  uint8_t *last = d + len - rem;
  memcpy(b, last, rem * sizeof (uint8_t));
  uint64_t totlen = prev + (uint64_t)len;
  update_block(wv, hash, true, totlen, b);
  Lib_Memzero0_memzero(b, 64U, uint8_t, void *);
}